

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O1

bool __thiscall
banksia::TourMng::pairingMatchList
          (TourMng *this,
          vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_> *playerVec,int round)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *name0;
  pointer pTVar2;
  _Alloc_hider _Var3;
  pointer pTVar4;
  pointer pMVar5;
  pointer pcVar6;
  uint uVar7;
  char cVar8;
  int iVar9;
  MatchRecord *r;
  long lVar10;
  long *plVar11;
  int *piVar12;
  undefined8 *puVar13;
  pointer pMVar14;
  uint uVar15;
  ulong uVar16;
  ulong *puVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  size_type *psVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  TourMng *pTVar23;
  char cVar24;
  undefined8 uVar25;
  uint uVar26;
  uint uVar27;
  __normal_iterator<banksia::TourPlayer_*,_std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>_>
  __i;
  pointer pTVar28;
  uint uVar29;
  bool bVar30;
  bool bVar31;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> str_2;
  string __str;
  string str;
  string __str_3;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  pairedSet;
  string local_1f0;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0;
  long lStack_1b8;
  ulong *local_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  ulong local_1a0 [2];
  TourMng *local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  ulong local_168;
  undefined1 local_160 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_150;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  int local_118;
  ulong *local_110;
  long local_108;
  ulong local_100 [2];
  undefined1 local_f0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0 [6];
  ResultType local_68;
  int local_3c;
  int local_38;
  
  local_168 = (ulong)(uint)round;
  pTVar2 = (playerVec->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(playerVec->
                 super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                 _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2;
  uVar16 = (lVar10 >> 4) * -0x3333333333333333;
  if (uVar16 < 2) {
    if (lVar10 == 0x50) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     "\n* The winner is ",&pTVar2->name);
      matchLog(this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
               true);
      if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
        operator_delete((void *)local_f0._0_8_);
      }
    }
    return false;
  }
  local_190 = this;
  if ((uVar16 & 1) != 0) {
    iVar22 = 9;
    uVar16 = 0xffffffff;
    do {
      iVar9 = rand();
      pTVar2 = (playerVec->
               super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
               _M_impl.super__Vector_impl_data._M_start;
      uVar20 = (ulong)(long)iVar9 %
               (ulong)(((long)(playerVec->
                              super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4) *
                      -0x3333333333333333);
      bVar30 = iVar22 != 0;
      iVar22 = iVar22 + -1;
      bVar31 = pTVar2[uVar20].byeCnt != 0;
      uVar20 = uVar20 & 0xffffffff;
      if (bVar31) {
        uVar20 = uVar16;
      }
      iVar9 = (int)uVar20;
    } while ((bVar31) && (uVar16 = uVar20, bVar30));
    if (iVar9 < 0) {
      pTVar2 = (playerVec->
               super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
               _M_impl.super__Vector_impl_data._M_start;
      lVar10 = (long)(playerVec->
                     super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2;
      if (lVar10 != 0) {
        lVar10 = (lVar10 >> 4) * -0x3333333333333333;
        piVar12 = &pTVar2->byeCnt;
        lVar21 = 0;
        do {
          if (*piVar12 == 0) {
            iVar9 = (int)lVar21;
            break;
          }
          lVar21 = lVar21 + 1;
          piVar12 = piVar12 + 0x14;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar21);
      }
    }
    if (iVar9 < 0) {
      iVar22 = rand();
      iVar9 = (int)((ulong)(long)iVar22 %
                   (ulong)(((long)(playerVec->
                                  super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                                  )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(playerVec->
                                  super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
                                  )._M_impl.super__Vector_impl_data._M_start >> 4) *
                          -0x3333333333333333));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "Warning: all players have been bye (odd players who got free wins).",0x43);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
    }
    pTVar23 = local_190;
    uVar20 = (ulong)iVar9;
    pTVar2 = (playerVec->
             super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar16 = ((long)(playerVec->
                    super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                    _M_impl.super__Vector_impl_data._M_finish - (long)pTVar2 >> 4) *
             -0x3333333333333333;
    if (uVar16 < uVar20 || uVar16 - uVar20 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
    }
    name0 = (string *)(local_160 + 8);
    local_160._0_8_ = &PTR__TourPlayer_001c21e8;
    local_160._8_8_ = local_150._M_local_buf + 8;
    _Var3._M_p = pTVar2[uVar20].name._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)name0,_Var3._M_p,_Var3._M_p + pTVar2[uVar20].name._M_string_length);
    local_118 = pTVar2[uVar20].whiteCnt;
    pTVar4 = pTVar2 + uVar20;
    local_138._0_4_ = pTVar4->gameCnt;
    local_138._4_4_ = pTVar4->winCnt;
    uStack_130 = *(undefined8 *)(&pTVar4->gameCnt + 2);
    pTVar2 = pTVar2 + uVar20;
    local_128._0_4_ = pTVar2->abnormalCnt;
    local_128._4_4_ = pTVar2->elo;
    uStack_120 = *(undefined8 *)(&pTVar2->abnormalCnt + 2);
    std::vector<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>::_M_erase
              (playerVec,
               (playerVec->
               super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
               _M_impl.super__Vector_impl_data._M_start + uVar20);
    local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"");
    uVar16 = local_168;
    MatchRecord::MatchRecord((MatchRecord *)local_f0,name0,&local_1f0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    local_f0._8_4_ = 2;
    local_68 = win;
    local_3c = (int)uVar16;
    local_38 = rand();
    addMatchRecord_simple(pTVar23,(MatchRecord *)local_f0);
    std::operator+(&local_188,"\n* Player ",name0);
    plVar11 = (long *)std::__cxx11::string::append((char *)&local_188);
    puVar17 = (ulong *)(plVar11 + 2);
    if ((ulong *)*plVar11 == puVar17) {
      local_1c0 = *puVar17;
      lStack_1b8 = plVar11[3];
      local_1d0 = &local_1c0;
    }
    else {
      local_1c0 = *puVar17;
      local_1d0 = (ulong *)*plVar11;
    }
    local_1c8 = plVar11[1];
    *plVar11 = (long)puVar17;
    plVar11[1] = 0;
    *(undefined1 *)(plVar11 + 2) = 0;
    uVar29 = (int)uVar16 + 1;
    uVar27 = -uVar29;
    if (0 < (int)uVar29) {
      uVar27 = uVar29;
    }
    uVar26 = 1;
    if (9 < uVar27) {
      uVar16 = (ulong)uVar27;
      uVar7 = 4;
      do {
        uVar26 = uVar7;
        uVar15 = (uint)uVar16;
        if (uVar15 < 100) {
          uVar26 = uVar26 - 2;
          goto LAB_0015ff09;
        }
        if (uVar15 < 1000) {
          uVar26 = uVar26 - 1;
          goto LAB_0015ff09;
        }
        if (uVar15 < 10000) goto LAB_0015ff09;
        uVar16 = uVar16 / 10000;
        uVar7 = uVar26 + 4;
      } while (99999 < uVar15);
      uVar26 = uVar26 + 1;
    }
LAB_0015ff09:
    local_1b0 = local_1a0;
    std::__cxx11::string::_M_construct((ulong)&local_1b0,(char)uVar26 - (char)((int)uVar29 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((long)local_1b0 + (ulong)(uVar29 >> 0x1f)),uVar26,uVar27);
    uVar16 = CONCAT44(uStack_1a4,local_1a8) + local_1c8;
    uVar20 = 0xf;
    if (local_1d0 != &local_1c0) {
      uVar20 = local_1c0;
    }
    if (uVar20 < uVar16) {
      uVar20 = 0xf;
      if (local_1b0 != local_1a0) {
        uVar20 = local_1a0[0];
      }
      if (uVar20 < uVar16) goto LAB_0015ff7d;
      puVar13 = (undefined8 *)
                std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,(ulong)local_1d0);
    }
    else {
LAB_0015ff7d:
      puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_1b0);
    }
    psVar19 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar19) {
      local_1f0.field_2._M_allocated_capacity = *psVar19;
      local_1f0.field_2._8_8_ = puVar13[3];
      local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *psVar19;
      local_1f0._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_1f0._M_string_length = puVar13[1];
    *puVar13 = psVar19;
    puVar13[1] = 0;
    *(undefined1 *)psVar19 = 0;
    if (local_1b0 != local_1a0) {
      operator_delete(local_1b0);
    }
    this = local_190;
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_188._M_dataplus._M_p != &local_188.field_2) {
      operator_delete(local_188._M_dataplus._M_p);
    }
    matchLog(this,&local_1f0,(bool)banksiaVerbose);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    MatchRecord::~MatchRecord((MatchRecord *)local_f0);
    local_160._0_8_ = &PTR__TourPlayer_001c21e8;
    if ((char *)local_160._8_8_ != local_150._M_local_buf + 8) {
      operator_delete((void *)local_160._8_8_);
    }
  }
  pTVar2 = (playerVec->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pTVar4 = (playerVec->super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (pTVar2 != pTVar4) {
    uVar16 = ((long)pTVar4 - (long)pTVar2 >> 4) * -0x3333333333333333;
    lVar10 = 0x3f;
    if (uVar16 != 0) {
      for (; uVar16 >> lVar10 == 0; lVar10 = lVar10 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
              (pTVar2,pTVar4,((uint)lVar10 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)pTVar4 - (long)pTVar2 < 0x501) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,__gnu_cxx::__ops::_Iter_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
                (pTVar2,pTVar4);
    }
    else {
      pTVar28 = pTVar2 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,__gnu_cxx::__ops::_Iter_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
                (pTVar2,pTVar28);
      for (; pTVar28 != pTVar4; pTVar28 = pTVar28 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<banksia::TourPlayer*,std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>>,__gnu_cxx::__ops::_Val_comp_iter<banksia::TourMng::pairingMatchList(std::vector<banksia::TourPlayer,std::allocator<banksia::TourPlayer>>,int)::__0>>
                  (pTVar28);
      }
    }
  }
  local_f0._24_8_ = local_f0 + 8;
  local_f0._8_4_ = _S_red;
  local_f0._16_8_ = 0;
  local_d0[0]._8_8_ = 0;
  pMVar14 = (this->matchRecordList).
            super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl.
            super__Vector_impl_data._M_start;
  pMVar5 = (this->matchRecordList).
           super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_d0[0]._0_8_ = local_f0._24_8_;
  if (pMVar14 != pMVar5) {
    do {
      if ((pMVar14->playernames[0]._M_string_length != 0) &&
         (pMVar14->playernames[1]._M_string_length != 0)) {
        pcVar6 = pMVar14->playernames[0]._M_dataplus._M_p;
        local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1f0,pcVar6,pcVar6 + pMVar14->playernames[0]._M_string_length);
        std::__cxx11::string::append((char *)&local_1f0);
        puVar13 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_1f0,(ulong)pMVar14->playernames[1]._M_dataplus._M_p);
        paVar18 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(puVar13 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*puVar13 == paVar18) {
          local_150._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_150._8_8_ = puVar13[3];
          local_160._0_8_ = &local_150;
        }
        else {
          local_150._M_allocated_capacity = paVar18->_M_allocated_capacity;
          local_160._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*puVar13;
        }
        local_160._8_8_ = puVar13[1];
        *puVar13 = paVar18;
        puVar13[1] = 0;
        *(undefined1 *)(puVar13 + 2) = 0;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)local_f0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_160._0_8_ != &local_150) {
          operator_delete((void *)local_160._0_8_);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          operator_delete(local_1f0._M_dataplus._M_p);
        }
      }
      pMVar14 = pMVar14 + 1;
    } while (pMVar14 != pMVar5);
  }
  pTVar23 = local_190;
  iVar22 = (int)local_168;
  bVar30 = pairingMatchListRecusive
                     (local_190,playerVec,iVar22,
                      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_f0);
  if (!bVar30) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Warning: All players have played together already.",0x32);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18));
    std::ostream::put('\0');
    std::ostream::flush();
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_f0);
    bVar30 = pairingMatchListRecusive
                       (pTVar23,playerVec,iVar22,
                        (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_f0);
    if (!bVar30) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error: cannot pair players.",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + '\x10');
      std::ostream::put('\x10');
      std::ostream::flush();
      bVar30 = false;
      goto LAB_00160a19;
    }
  }
  std::__cxx11::string::string
            ((string *)&local_188,tourTypeNames[(int)pTVar23->type],(allocator *)&local_110);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_188,0,(char *)0x0,0x18879b);
  local_1d0 = &local_1c0;
  puVar17 = (ulong *)(plVar11 + 2);
  if ((ulong *)*plVar11 == puVar17) {
    local_1c0 = *puVar17;
    lStack_1b8 = plVar11[3];
  }
  else {
    local_1c0 = *puVar17;
    local_1d0 = (ulong *)*plVar11;
  }
  local_1c8 = plVar11[1];
  *plVar11 = (long)puVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  plVar11 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  paVar18 = &local_1f0.field_2;
  puVar17 = (ulong *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar17) {
    local_1f0.field_2._M_allocated_capacity = *puVar17;
    local_1f0.field_2._8_8_ = plVar11[3];
    local_1f0._M_dataplus._M_p = (pointer)paVar18;
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *puVar17;
    local_1f0._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_1f0._M_string_length = plVar11[1];
  *plVar11 = (long)puVar17;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  uVar29 = iVar22 + 1;
  uVar27 = -uVar29;
  if (0 < (int)uVar29) {
    uVar27 = uVar29;
  }
  uVar26 = 1;
  if (9 < uVar27) {
    uVar16 = (ulong)uVar27;
    uVar7 = 4;
    do {
      uVar26 = uVar7;
      uVar15 = (uint)uVar16;
      if (uVar15 < 100) {
        uVar26 = uVar26 - 2;
        goto LAB_00160438;
      }
      if (uVar15 < 1000) {
        uVar26 = uVar26 - 1;
        goto LAB_00160438;
      }
      if (uVar15 < 10000) goto LAB_00160438;
      uVar16 = uVar16 / 10000;
      uVar7 = uVar26 + 4;
    } while (99999 < uVar15);
    uVar26 = uVar26 + 1;
  }
LAB_00160438:
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,(char)uVar26 - (char)((int)uVar29 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar29 >> 0x1f) + (long)local_1b0),uVar26,uVar27);
  uVar16 = CONCAT44(uStack_1a4,local_1a8) + local_1f0._M_string_length;
  uVar25 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar18) {
    uVar25 = local_1f0.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar25 < uVar16) {
    uVar20 = 0xf;
    if (local_1b0 != local_1a0) {
      uVar20 = local_1a0[0];
    }
    if (uVar20 < uVar16) goto LAB_001604b1;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_1b0,0,(char *)0x0,(ulong)local_1f0._M_dataplus._M_p);
  }
  else {
LAB_001604b1:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1f0,(ulong)local_1b0);
  }
  local_160._0_8_ = &local_150;
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(puVar13 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 == paVar1) {
    local_150._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_150._8_8_ = puVar13[3];
  }
  else {
    local_150._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_160._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)*puVar13;
  }
  local_160._8_8_ = puVar13[1];
  *puVar13 = paVar1;
  puVar13[1] = 0;
  paVar1->_M_local_buf[0] = '\0';
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar18) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (pTVar23->type == swiss) {
    uVar27 = pTVar23->swissRounds;
    uVar29 = -uVar27;
    if (0 < (int)uVar27) {
      uVar29 = uVar27;
    }
    uVar26 = 1;
    if (9 < uVar29) {
      uVar16 = (ulong)uVar29;
      uVar7 = 4;
      do {
        uVar26 = uVar7;
        uVar15 = (uint)uVar16;
        if (uVar15 < 100) {
          uVar26 = uVar26 - 2;
          goto LAB_001605e1;
        }
        if (uVar15 < 1000) {
          uVar26 = uVar26 - 1;
          goto LAB_001605e1;
        }
        if (uVar15 < 10000) goto LAB_001605e1;
        uVar16 = uVar16 / 10000;
        uVar7 = uVar26 + 4;
      } while (99999 < uVar15);
      uVar26 = uVar26 + 1;
    }
LAB_001605e1:
    local_1d0 = &local_1c0;
    std::__cxx11::string::_M_construct((ulong)&local_1d0,(char)uVar26 - (char)((int)uVar27 >> 0x1f))
    ;
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar27 >> 0x1f) + (long)local_1d0),uVar26,uVar29);
    puVar13 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,0x18996f);
    pTVar23 = local_190;
    puVar17 = puVar13 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar13 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar17) {
      local_1f0.field_2._M_allocated_capacity = *puVar17;
      local_1f0.field_2._8_8_ = puVar13[3];
      local_1f0._M_dataplus._M_p = (pointer)paVar18;
    }
    else {
      local_1f0.field_2._M_allocated_capacity = *puVar17;
      local_1f0._M_dataplus._M_p = (pointer)*puVar13;
    }
    local_1f0._M_string_length = puVar13[1];
    *puVar13 = puVar17;
    puVar13[1] = 0;
    *(undefined1 *)(puVar13 + 2) = 0;
    std::__cxx11::string::_M_append(local_160,(ulong)local_1f0._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f0._M_dataplus._M_p != paVar18) {
      operator_delete(local_1f0._M_dataplus._M_p);
    }
    if (local_1d0 != &local_1c0) {
      operator_delete(local_1d0);
    }
  }
  uVar16 = ((long)(playerVec->
                  super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(playerVec->
                  super__Vector_base<banksia::TourPlayer,_std::allocator<banksia::TourPlayer>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 4) * -0x3333333333333333;
  uVar20 = uVar16 >> 1;
  cVar24 = '\x01';
  if (0x13 < uVar16) {
    uVar16 = uVar20;
    cVar8 = '\x04';
    do {
      cVar24 = cVar8;
      if (uVar16 < 100) {
        cVar24 = cVar24 + -2;
        goto LAB_0016072c;
      }
      if (uVar16 < 1000) {
        cVar24 = cVar24 + -1;
        goto LAB_0016072c;
      }
      if (uVar16 < 10000) goto LAB_0016072c;
      bVar30 = 99999 < uVar16;
      uVar16 = uVar16 / 10000;
      cVar8 = cVar24 + '\x04';
    } while (bVar30);
    cVar24 = cVar24 + '\x01';
  }
LAB_0016072c:
  local_1b0 = local_1a0;
  std::__cxx11::string::_M_construct((ulong)&local_1b0,cVar24);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_1b0,local_1a8,uVar20);
  plVar11 = (long *)std::__cxx11::string::replace((ulong)&local_1b0,0,(char *)0x0,0x18c082);
  psVar19 = (size_type *)(plVar11 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar11 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_188.field_2._M_allocated_capacity = *psVar19;
    local_188.field_2._8_8_ = plVar11[3];
    local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  }
  else {
    local_188.field_2._M_allocated_capacity = *psVar19;
    local_188._M_dataplus._M_p = (pointer)*plVar11;
  }
  local_188._M_string_length = plVar11[1];
  *plVar11 = (long)psVar19;
  plVar11[1] = 0;
  *(undefined1 *)(plVar11 + 2) = 0;
  puVar13 = (undefined8 *)std::__cxx11::string::append((char *)&local_188);
  puVar17 = puVar13 + 2;
  if ((ulong *)*puVar13 == puVar17) {
    local_1c0 = *puVar17;
    lStack_1b8 = puVar13[3];
    local_1d0 = &local_1c0;
  }
  else {
    local_1c0 = *puVar17;
    local_1d0 = (ulong *)*puVar13;
  }
  local_1c8 = puVar13[1];
  *puVar13 = puVar17;
  puVar13[1] = 0;
  *(undefined1 *)(puVar13 + 2) = 0;
  uVar27 = 0;
  for (pMVar14 = (pTVar23->matchRecordList).
                 super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      pMVar14 !=
      (pTVar23->matchRecordList).
      super__Vector_base<banksia::MatchRecord,_std::allocator<banksia::MatchRecord>_>._M_impl.
      super__Vector_impl_data._M_finish; pMVar14 = pMVar14 + 1) {
    uVar27 = uVar27 + (pMVar14->state == none);
  }
  uVar29 = -uVar27;
  if (0 < (int)uVar27) {
    uVar29 = uVar27;
  }
  uVar26 = 1;
  if (9 < uVar29) {
    uVar16 = (ulong)uVar29;
    uVar7 = 4;
    do {
      uVar26 = uVar7;
      uVar15 = (uint)uVar16;
      if (uVar15 < 100) {
        uVar26 = uVar26 - 2;
        goto LAB_0016088a;
      }
      if (uVar15 < 1000) {
        uVar26 = uVar26 - 1;
        goto LAB_0016088a;
      }
      if (uVar15 < 10000) goto LAB_0016088a;
      uVar16 = uVar16 / 10000;
      uVar7 = uVar26 + 4;
    } while (99999 < uVar15);
    uVar26 = uVar26 + 1;
  }
LAB_0016088a:
  local_110 = local_100;
  std::__cxx11::string::_M_construct((ulong)&local_110,(char)uVar26 - (char)((int)uVar27 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar27 >> 0x1f) + (long)local_110),uVar26,uVar29);
  uVar16 = 0xf;
  if (local_1d0 != &local_1c0) {
    uVar16 = local_1c0;
  }
  if (uVar16 < (ulong)(local_108 + local_1c8)) {
    uVar16 = 0xf;
    if (local_110 != local_100) {
      uVar16 = local_100[0];
    }
    if (uVar16 < (ulong)(local_108 + local_1c8)) goto LAB_00160910;
    puVar13 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_110,0,(char *)0x0,(ulong)local_1d0);
  }
  else {
LAB_00160910:
    puVar13 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_1d0,(ulong)local_110);
  }
  psVar19 = puVar13 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar13 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar19) {
    local_1f0.field_2._M_allocated_capacity = *psVar19;
    local_1f0.field_2._8_8_ = puVar13[3];
    local_1f0._M_dataplus._M_p = (pointer)paVar18;
  }
  else {
    local_1f0.field_2._M_allocated_capacity = *psVar19;
    local_1f0._M_dataplus._M_p = (pointer)*puVar13;
  }
  local_1f0._M_string_length = puVar13[1];
  *puVar13 = psVar19;
  puVar13[1] = 0;
  *(undefined1 *)psVar19 = 0;
  std::__cxx11::string::_M_append(local_160,(ulong)local_1f0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != paVar18) {
    operator_delete(local_1f0._M_dataplus._M_p);
  }
  if (local_110 != local_100) {
    operator_delete(local_110);
  }
  if (local_1d0 != &local_1c0) {
    operator_delete(local_1d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  matchLog(pTVar23,(string *)local_160,true);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._0_8_ != &local_150) {
    operator_delete((void *)local_160._0_8_);
  }
  bVar30 = true;
LAB_00160a19:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_f0);
  return bVar30;
}

Assistant:

bool TourMng::pairingMatchList(std::vector<TourPlayer> playerVec, int round)
{
    if (playerVec.size() < 2) {
        if (playerVec.size() == 1) {
            auto str = "\n* The winner is " + playerVec.front().name;
            matchLog(str, true);
        }
        return false;
    }
    
    // odd/bye players, one won't have opponent and he is lucky to set win
    if (playerVec.size() & 1) {
        auto luckyIdx = -1;
        for (int i = 0; i < 10; i++) {
            auto k = std::rand() % playerVec.size();
            if (playerVec.at(k).byeCnt == 0) {
                luckyIdx = int(k);
                break;
            }
        }
        
        if (luckyIdx < 0) {
            for (int i = 0; i <  playerVec.size(); i++) {
                if (playerVec.at(i).byeCnt == 0) {
                    luckyIdx = i;
                    break;
                }
            }
        }
        
        if (luckyIdx < 0) {
            luckyIdx = std::rand() % playerVec.size();
            std::cerr << "Warning: all players have been bye (odd players who got free wins)." << std::endl;
        }
        
        auto luckPlayer = playerVec.at(luckyIdx);
        
        {
            auto it = playerVec.begin();
            std::advance(it, luckyIdx);
            playerVec.erase(it);
        }
        
        
        // the odd player wins all games in the round
        MatchRecord record(luckPlayer.name, "", false);
        record.round = round;
        record.state = MatchState::completed;
        record.result.result = ResultType::win; // win
        record.pairId = std::rand();
        addMatchRecord_simple(record);
        
        auto str = "\n* Player " + luckPlayer.name + " is an odd one (no opponent to pair with) and receives a bye (a win) for round " + std::to_string(round + 1);
        matchLog(str, banksiaVerbose);
    }
    
    std::sort(playerVec.begin(), playerVec.end(), [](const TourPlayer& lhs, const TourPlayer& rhs)
              {
                  return lhs.getScore() > rhs.getScore();
              });
    
    std::set<std::string> pairedSet;
    for(auto && m : matchRecordList) {
        if (m.playernames[0].empty() || m.playernames[1].empty()) continue;
        pairedSet.insert(m.playernames[0] + "*" + m.playernames[1]);
    }
    
    if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
        std::cout << "Warning: All players have played together already." << std::endl;
        pairedSet.clear();
        if (!pairingMatchListRecusive(playerVec, round, pairedSet)) {
            std::cerr << "Error: cannot pair players." << std::endl;
            return false;
        }
    }
    
    std::string str = "\n" + std::string(tourTypeNames[static_cast<int>(type)]) + " round: " + std::to_string(round + 1);
    if (type == TourType::swiss) {
        str += "/" + std::to_string(swissRounds);
    }
    str += ", pairs: " + std::to_string(playerVec.size() / 2) + ", matches: " + std::to_string(uncompletedMatches());
    
    matchLog(str, true);
    return true;
}